

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

uint8_t * __thiscall
icu_63::RuleBasedBreakIterator::getBinaryRules(RuleBasedBreakIterator *this,uint32_t *length)

{
  RBBIDataHeader *local_20;
  uint8_t *retPtr;
  uint32_t *length_local;
  RuleBasedBreakIterator *this_local;
  
  local_20 = (RBBIDataHeader *)0x0;
  *length = 0;
  if (this->fData != (RBBIDataWrapper *)0x0) {
    local_20 = this->fData->fHeader;
    *length = this->fData->fHeader->fLength;
  }
  return (uint8_t *)local_20;
}

Assistant:

const uint8_t  *RuleBasedBreakIterator::getBinaryRules(uint32_t &length) {
    const uint8_t  *retPtr = NULL;
    length = 0;

    if (fData != NULL) {
        retPtr = (const uint8_t *)fData->fHeader;
        length = fData->fHeader->fLength;
    }
    return retPtr;
}